

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O2

void __thiscall dd::ProcessThreadImpl::Stop(ProcessThreadImpl *this)

{
  PlatformThread *pPVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  
  bVar2 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (bVar2) {
    if ((this->_thread)._M_t.
        super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
        super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
        super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl != (PlatformThread *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)&this->_lock);
      this->_stop = true;
      pthread_mutex_unlock((pthread_mutex_t *)&this->_lock);
      Event::Set(&this->_wake_up);
      PlatformThread::Stop
                ((this->_thread)._M_t.
                 super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>
                 .super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl);
      this->_stop = false;
      pPVar1 = (this->_thread)._M_t.
               super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>.
               _M_t.
               super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>
               .super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl;
      (this->_thread)._M_t.
      super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
      super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl = (PlatformThread *)0x0;
      if (pPVar1 != (PlatformThread *)0x0) {
        (*pPVar1->_vptr_PlatformThread[1])();
      }
      p_Var3 = (_List_node_base *)&this->_modules;
      while (p_Var3 = (((_List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
                         *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != (_List_node_base *)&this->_modules) {
        (**(code **)(*(long *)p_Var3[1]._M_next + 0x10))(p_Var3[1]._M_next,0);
      }
    }
    return;
  }
  __assert_fail("_thread_checker.IsCurrent()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                ,0x3c,"virtual void dd::ProcessThreadImpl::Stop()");
}

Assistant:

void ProcessThreadImpl::Stop() {
		assert(_thread_checker.IsCurrent());
		if (!_thread.get())
			return;
		{
			AutoLock l(_lock);
			_stop = true;
		}
		_wake_up.Set();
		_thread->Stop();
		_stop = false;
		_thread.reset();
		for (ModuleCallback& m : _modules)
			m.module->ProcessThreadAttached(nullptr);
	}